

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall restincurl::Request::Request(Request *this)

{
  _Head_base<0UL,_restincurl::EasyHandle_*,_false> _Var1;
  EasyHandle EVar2;
  
  _Var1._M_head_impl = (EasyHandle *)operator_new(8);
  EVar2.handle_ = (handle_t)curl_easy_init();
  (_Var1._M_head_impl)->handle_ = EVar2.handle_;
  (this->eh_)._M_t.
  super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>._M_t.
  super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>.
  super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl = _Var1._M_head_impl;
  this->request_type_ = INVALID;
  *(undefined8 *)&(this->completion_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->completion_).super__Function_base._M_functor + 8) = 0;
  (this->completion_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->completion_)._M_invoker = (_Invoker_type)0x0;
  (this->default_out_handler_)._M_t.
  super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
  .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl = (DataHandlerBase *)0x0
  ;
  (this->default_in_handler_)._M_t.
  super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
  .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl = (DataHandlerBase *)0x0
  ;
  this->headers_ = (headers_t)0x0;
  (this->default_data_buffer_)._M_dataplus._M_p = (pointer)&(this->default_data_buffer_).field_2;
  (this->default_data_buffer_)._M_string_length = 0;
  (this->default_data_buffer_).field_2._M_local_buf[0] = '\0';
  (this->fp_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->fp_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->mime_ = (curl_mime *)0x0;
  return;
}

Assistant:

Request()
        : eh_{std::make_unique<EasyHandle>()}
        {
        }